

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O0

void __thiscall wasm::SSAify::computeGetsAndPhis(SSAify *this,LocalGraph *graph)

{
  Index index;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *this_00;
  bool bVar1;
  Index index_00;
  reference ppLVar2;
  size_t sVar3;
  value_type *ppLVar4;
  Expression *pEVar5;
  mapped_type *pppEVar6;
  size_type sVar7;
  Expression **ppEVar8;
  LocalGet *value_00;
  LocalSet *local_148;
  uintptr_t local_140;
  LocalSet *local_138;
  LocalSet *set_2;
  LocalSet *local_128;
  LocalSet *tee;
  Expression *value;
  LocalSet *set_1;
  Iterator __end3;
  Iterator __begin3;
  mapped_type *__range3;
  Builder builder;
  Index old;
  key_type pEStack_a8;
  Index new_;
  uintptr_t local_a0;
  uintptr_t local_98;
  Iterator local_90;
  value_type local_70;
  LocalSet *set;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *local_58;
  mapped_type *sets;
  LocalGet *get;
  iterator __end2;
  iterator __begin2;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *__range2;
  FindAll<wasm::LocalGet> gets;
  LocalGraph *graph_local;
  SSAify *this_local;
  
  gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)graph;
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)&__range2,this->func->body);
  __end2 = std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::begin
                     ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)&__range2);
  get = (LocalGet *)
        std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::end
                  ((vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)&__range2);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
                                *)&get);
    if (!bVar1) {
      FindAll<wasm::LocalGet>::~FindAll((FindAll<wasm::LocalGet> *)&__range2);
      return;
    }
    ppLVar2 = __gnu_cxx::
              __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
              ::operator*(&__end2);
    sets = (mapped_type *)*ppLVar2;
    local_58 = &std::
                unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                ::operator[]((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
                              *)gets.list.
                                super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(key_type *)&sets
                            )->
                super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ;
    sVar3 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            ::size(local_58);
    if (sVar3 != 0) {
      sVar3 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              ::size(local_58);
      if (sVar3 == 1) {
        SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        ::begin(&local_90,local_58);
        ppLVar4 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                  ::
                  IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                  ::operator*(&local_90);
        local_70 = *ppLVar4;
        if (local_70 == (value_type)0x0) {
          bVar1 = Function::isParam(this->func,
                                    *(Index *)((sets->
                                               super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                               ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>
                                               .storage._M_elems + 1));
          if (!bVar1) {
            local_98 = (uintptr_t)
                       (sets->
                       super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                       ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems[0];
            bVar1 = LiteralUtils::canMakeZero((Type)local_98);
            if (bVar1) {
              local_a0 = (uintptr_t)
                         (sets->
                         super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems[0];
              pEVar5 = LiteralUtils::makeZero((Type)local_a0,this->module);
              pEStack_a8 = (key_type)sets;
              pppEVar6 = std::
                         map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                         ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                       *)(gets.list.
                                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                                      &stack0xffffffffffffff58);
              **pppEVar6 = pEVar5;
            }
          }
        }
        else {
          *(Index *)((sets->
                     super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                     ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems + 1) =
               local_70->index;
        }
      }
      else if ((this->allowMerges & 1U) != 0) {
        index_00 = addLocal(this,(Type)(sets->
                                       super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                       ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage
                                       ._M_elems[0]);
        builder.wasm._4_4_ =
             *(Index *)((sets->
                        super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                        ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems + 1);
        *(Index *)((sets->
                   super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                   ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems + 1) =
             index_00;
        Builder::Builder((Builder *)&__range3,this->module);
        this_00 = local_58;
        SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        ::begin((Iterator *)&__end3.flexibleIterator,local_58);
        SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        ::end((Iterator *)&set_1,this_00);
        while (bVar1 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                       ::
                       IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                       ::operator!=((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                     *)&__end3.flexibleIterator,(Iterator *)&set_1), bVar1) {
          ppLVar4 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                    ::
                    IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                    ::operator*((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                 *)&__end3.flexibleIterator);
          value = (Expression *)*ppLVar4;
          if ((value_type)value == (value_type)0x0) {
            bVar1 = Function::isParam(this->func,builder.wasm._4_4_);
            index = builder.wasm._4_4_;
            if (bVar1) {
              local_140 = (uintptr_t)Function::getLocalType(this->func,builder.wasm._4_4_);
              value_00 = Builder::makeLocalGet((Builder *)&__range3,index,(Type)local_140);
              local_148 = Builder::makeLocalSet
                                    ((Builder *)&__range3,index_00,(Expression *)value_00);
              local_138 = local_148;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        (&this->functionPrepends,(value_type *)&local_148);
            }
          }
          else {
            tee = (LocalSet *)((value_type)value)->value;
            set_2 = (sets->
                    super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                    ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems[0];
            local_128 = Builder::makeLocalTee
                                  ((Builder *)&__range3,index_00,(Expression *)tee,(Type)set_2);
            value[1].type.id = (uintptr_t)local_128;
            sVar7 = std::
                    map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                    ::count((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                             *)(gets.list.
                                super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                            (key_type *)&tee);
            if (sVar7 != 0) {
              pppEVar6 = std::
                         map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                         ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                       *)(gets.list.
                                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                                      (key_type *)&tee);
              if ((Type *)*pppEVar6 != &value[1].type) {
                __assert_fail("graph.locations[value] == &set->value",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SSAify.cpp"
                              ,0xab,"void wasm::SSAify::computeGetsAndPhis(LocalGraph &)");
              }
              ppEVar8 = &local_128->value;
              pppEVar6 = std::
                         map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                         ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                       *)(gets.list.
                                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                                      (key_type *)&tee);
              *pppEVar6 = ppEVar8;
            }
          }
          SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ::
          IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
          ::operator++((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                        *)&__end3.flexibleIterator);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<wasm::LocalGet_**,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void computeGetsAndPhis(LocalGraph& graph) {
    FindAll<LocalGet> gets(func->body);
    for (auto* get : gets.list) {
      auto& sets = graph.getSetses[get];
      if (sets.size() == 0) {
        continue; // unreachable, ignore
      }
      if (sets.size() == 1) {
        // easy, just one set, use its index
        auto* set = *sets.begin();
        if (set) {
          get->index = set->index;
        } else {
          // no set, assign param or zero
          if (func->isParam(get->index)) {
            // leave it, it's fine
          } else if (LiteralUtils::canMakeZero(get->type)) {
            // zero it out
            (*graph.locations[get]) =
              LiteralUtils::makeZero(get->type, *module);
          } else {
            // No zero exists here, so this is a nondefaultable type. The
            // default won't be used anyhow, so this value does not really
            // matter and we have nothing to do.
          }
        }
        continue;
      }
      if (!allowMerges) {
        continue;
      }
      // more than 1 set, need a phi: a new local written to at each of the sets
      auto new_ = addLocal(get->type);
      auto old = get->index;
      get->index = new_;
      Builder builder(*module);
      // write to the local in each of our sets
      for (auto* set : sets) {
        if (set) {
          // a set exists, just add a tee of its value
          auto* value = set->value;
          auto* tee = builder.makeLocalTee(new_, value, get->type);
          set->value = tee;
          // the value may have been something we tracked the location
          // of. if so, update that, since we moved it into the tee
          if (graph.locations.count(value) > 0) {
            assert(graph.locations[value] == &set->value);
            graph.locations[value] = &tee->value;
          }
        } else {
          // this is a param or the zero init value.
          if (func->isParam(old)) {
            // we add a set with the proper
            // param value at the beginning of the function
            auto* set = builder.makeLocalSet(
              new_, builder.makeLocalGet(old, func->getLocalType(old)));
            functionPrepends.push_back(set);
          } else {
            // this is a zero init, so we don't need to do anything actually
          }
        }
      }
    }
  }